

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::check_basename_match_word_prefix
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  *this_00;
  pointer *pp_Var1;
  char32_t *pcVar2;
  pointer p_Var3;
  iterator iVar4;
  char32_t *pcVar5;
  char32_t *pcVar6;
  pointer pCVar7;
  Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *pMVar8;
  Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *pMVar9;
  long lVar10;
  char32_t *pcVar11;
  pointer pCVar12;
  byte bVar13;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> _Var14;
  byte bVar15;
  bool bVar16;
  byte bVar17;
  byte bVar18;
  bool bVar19;
  char32_t *pcVar20;
  pointer pCVar21;
  Iterator query_it;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> local_48;
  vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
  *local_40;
  Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *local_38;
  
  p_Var3 = (this->qit_basename_words_).
           super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->qit_basename_words_).
      super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != p_Var3) {
    (this->qit_basename_words_).
    super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = p_Var3;
  }
  this_00 = &this->qit_basename_words_;
  iVar4._M_current =
       (this->qit_basename_words_).
       super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->qit_basename_words_).
      super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
    ::
    _M_realloc_insert<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>const&>
              ((vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
                *)this_00,iVar4,&this->qit_basename_);
  }
  else {
    (iVar4._M_current)->_M_current = (this->qit_basename_)._M_current;
    pp_Var1 = &(this->qit_basename_words_).
               super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pp_Var1 = *pp_Var1 + 1;
  }
  pcVar5 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar11 = (this->item_basename_)._M_current;
  if (pcVar5 != pcVar11) {
    local_48._M_current = (this->qit_basename_)._M_current;
    pcVar6 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar6 != local_48._M_current) {
      pCVar7 = (this->props_).
               super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(this->item_basename_)._M_current -
               (long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      pCVar12 = pCVar7 + lVar10;
      pCVar7 = pCVar7 + lVar10;
      pCVar7->word_start = true;
      bVar16 = true;
      bVar17 = pCVar7->uppercase;
      bVar13 = pCVar7->alphanumeric;
      do {
        pcVar20 = pcVar11;
        pCVar21 = pCVar7 + 1;
        local_40 = (vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
                    *)this_00;
        pMVar8 = local_38;
        if ((bVar16) || ((bVar13 & 1) == 0)) {
          if (*pcVar20 == *local_48._M_current) {
            local_48._M_current = local_48._M_current + 1;
            pMVar9 = this;
            if (local_48._M_current == pcVar6) goto joined_r0x001348b0;
          }
          else {
            bVar16 = false;
          }
        }
        bVar15 = bVar17;
        bVar18 = bVar13;
        if (pcVar20 + 1 == pcVar5) break;
        bVar15 = pCVar21->uppercase;
        bVar18 = pCVar7[1].alphanumeric;
        if (((bVar17 & 1) == 0) && ((bool)bVar15 != false)) {
          pCVar7[1].word_start = true;
          pcVar20 = pcVar20 + 1;
          pMVar9 = this;
          pCVar7 = pCVar21;
          bVar17 = bVar15;
          bVar13 = bVar18;
          goto joined_r0x001348b0;
        }
        pCVar12 = pCVar12 + 1;
        bVar19 = (bool)(~bVar13 & bVar18 & 1);
        pCVar7[1].word_start = bVar19;
        pcVar11 = pcVar20 + 1;
        bVar17 = bVar15;
        bVar13 = bVar18;
        pCVar7 = pCVar21;
      } while (bVar19 == false);
      pcVar20 = pcVar20 + 1;
      pMVar9 = this;
      pCVar7 = pCVar12;
      bVar17 = bVar15;
      bVar13 = bVar18;
joined_r0x001348b0:
      do {
        pCVar12 = pCVar7;
        local_38 = pMVar9;
        bVar16 = local_48._M_current == pcVar6;
        if (bVar16) {
          this->prefix_level_ = BASENAME_WORD;
          iVar4._M_current =
               (this->qit_basename_words_).
               super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current !=
              (this->qit_basename_words_).
              super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            (iVar4._M_current)->_M_current = local_48._M_current;
            pp_Var1 = &(this->qit_basename_words_).
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pp_Var1 = *pp_Var1 + 1;
            return bVar16;
          }
          local_38 = pMVar8;
          std::
          vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>const&>
                    (local_40,iVar4,&local_48);
          return bVar16;
        }
        if (pcVar20 == pcVar5) {
          this->basename_longest_submatch_ = 0;
          this->basename_word_gaps_ = 0;
          return bVar16;
        }
        _Var14._M_current = local_48._M_current;
        if (*pcVar20 != *local_48._M_current) {
          pcVar11 = local_48._M_current;
          do {
            _Var14._M_current = local_48._M_current;
            if (pcVar11 <=
                (this->qit_basename_words_).
                super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current + 1) break;
            _Var14._M_current = pcVar11 + -1;
            pcVar2 = pcVar11 + -1;
            pcVar11 = _Var14._M_current;
          } while (*pcVar20 != *pcVar2);
        }
        local_48._M_current = _Var14._M_current;
        iVar4._M_current =
             (this->qit_basename_words_).
             super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->qit_basename_words_).
            super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>const&>
                    (local_40,iVar4,&local_48);
          this = local_38;
        }
        else {
          (iVar4._M_current)->_M_current = local_48._M_current;
          pp_Var1 = &(this->qit_basename_words_).
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pp_Var1 = *pp_Var1 + 1;
        }
        bVar16 = true;
        _Var14._M_current = local_48._M_current;
        pcVar11 = pcVar20;
        pCVar7 = pCVar12;
        do {
          pcVar20 = pcVar11;
          pCVar21 = pCVar7 + 1;
          pMVar9 = local_38;
          pMVar8 = local_38;
          if ((bVar16) || ((bVar13 & 1) == 0)) {
            if (*pcVar20 == *_Var14._M_current) {
              _Var14._M_current = _Var14._M_current + 1;
              local_48._M_current = _Var14._M_current;
              if (_Var14._M_current == pcVar6) goto joined_r0x001348b0;
            }
            else {
              bVar16 = false;
            }
          }
          bVar15 = bVar17;
          bVar18 = bVar13;
          if (pcVar20 + 1 == pcVar5) break;
          bVar15 = pCVar21->uppercase;
          bVar18 = pCVar7[1].alphanumeric;
          if (((bVar17 & 1) == 0) && ((bool)bVar15 != false)) {
            pCVar7[1].word_start = true;
            pCVar12 = pCVar21;
            break;
          }
          pCVar12 = pCVar12 + 1;
          bVar19 = (bool)(~bVar13 & bVar18 & 1);
          pCVar7[1].word_start = bVar19;
          pcVar11 = pcVar20 + 1;
          bVar17 = bVar15;
          bVar13 = bVar18;
          pCVar7 = pCVar21;
        } while (bVar19 == false);
        pcVar20 = pcVar20 + 1;
        pCVar7 = pCVar12;
        bVar17 = bVar15;
        bVar13 = bVar18;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool check_basename_match_word_prefix() {
    qit_basename_words_.clear();
    qit_basename_words_.push_back(qit_basename_);

    auto item_it = item_basename_;
    auto const item_last = item_.cend();
    if (item_it == item_last) {
      return false;
    }
    auto query_it = qit_basename_;
    auto const query_last = query_.cend();
    if (query_it == query_last) {
      return false;
    }
    auto props_it = props_.begin() + (item_basename_ - item_.cbegin());

    bool prev_uppercase = props_it->uppercase;
    bool prev_alphanumeric = props_it->alphanumeric;
    props_it->word_start = true;

    // Advances `item_it` and `props_it` to the beginning of the next word. For
    // each consecutive iterated character in the item matched by a character
    // in the query before `query_last`, advances `query_it`.
    //
    // Precondition: `item_it != item_last`; `query_it != query_last`.
    // Postcondition: `item_it` is always advanced by at least 1.
    auto const consume_word_prefix = [&] {
      bool can_match = true;
      while (true) {
        // Require that all alphanumeric matches in this word be contiguous.
        if (can_match || !prev_alphanumeric) {
          if (*item_it == *query_it) {
            ++query_it;
            if (query_it == query_last) {
              break;
            }
          } else {
            can_match = false;
          }
        }
        ++item_it;
        if (item_it == item_last) {
          break;
        }
        ++props_it;
        bool const uppercase = props_it->uppercase;
        bool const alphanumeric = props_it->alphanumeric;
        bool const word_start = (!prev_uppercase && uppercase) ||
                                (!prev_alphanumeric && alphanumeric);
        props_it->word_start = word_start;
        prev_uppercase = uppercase;
        prev_alphanumeric = alphanumeric;
        if (word_start) {
          break;
        }
      }
    };

    consume_word_prefix();
    while (query_it != query_last) {
      if (item_it == item_last) {
        basename_longest_submatch_ = 0;
        basename_word_gaps_ = 0;
        return false;
      }
      // If the next unmatched query character doesn't match the first
      // character of the next word, allow partial backtracking (all but the
      // first character) of the match in the previous word in order to find a
      // match for this one.
      auto const c = *item_it;
      if (c != *query_it) {
        for (auto steal_rit = ReverseIterator(query_it),
                  steal_rlast = ReverseIterator(qit_basename_words_.back() + 1);
             steal_rit < steal_rlast; ++steal_rit) {
          if (c == *steal_rit) {
            query_it = (steal_rit + 1).base();
            break;
          }
        }
      }
      qit_basename_words_.push_back(query_it);
      consume_word_prefix();
    }
    prefix_level_ = PrefixLevel::BASENAME_WORD;
    // Push `query_it` onto `qit_basename_words_` even though we know it's
    // `query_.cend()` to avoid special-casing the end case in
    // `score_basename_word_prefix_match`.
    qit_basename_words_.push_back(query_it);
    return true;
  }